

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O2

void soplex::
     initConstVecs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *vecset,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *facset,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *veclogs,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *vecnnzinv,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *epsilon)

{
  Item *pIVar1;
  undefined1 uVar2;
  uint uVar3;
  int iVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  Item *pIVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this;
  long lVar12;
  long lVar13;
  ulong uVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  undefined4 *puVar15;
  undefined4 *puVar16;
  cpp_dec_float<200u,int,void> *pcVar17;
  uint *puVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  undefined4 *puVar20;
  multiprecision *pmVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  ulong uVar23;
  byte bVar24;
  double dVar25;
  int local_57c;
  double local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nnzinv;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  logsum;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_420;
  multiprecision local_3a0 [112];
  int local_330;
  undefined1 local_32c;
  fpclass_type local_328;
  int32_t local_324;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_320;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_220;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_120;
  undefined4 local_a0 [28];
  
  bVar24 = 0;
  uVar3 = (vecset->set).thenum;
  uVar14 = 0;
  uVar10 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar10 = uVar14;
  }
  for (; uVar14 != uVar10; uVar14 = uVar14 + 1) {
    uVar23 = 0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&logsum.m_backend,0.0,(type *)0x0);
    pIVar7 = (vecset->set).theitem;
    iVar4 = (vecset->set).thekey[uVar14].idx;
    pIVar1 = pIVar7 + iVar4;
    uVar3 = pIVar7[iVar4].data.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused;
    uVar11 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar11 = uVar23;
    }
    local_57c = 0;
    while( true ) {
      lVar13 = 0x1c;
      if (uVar11 * 0x84 == uVar23) break;
      pNVar8 = (pIVar1->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      puVar16 = (undefined4 *)((long)&(pNVar8->val).m_backend.data + uVar23);
      puVar15 = puVar16;
      puVar20 = local_a0;
      for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
        *puVar20 = *puVar15;
        puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
        puVar20 = puVar20 + (ulong)bVar24 * -2 + 1;
      }
      iVar4 = *(int *)((long)&(pNVar8->val).m_backend.data + uVar23 + 0x70);
      uVar2 = *(undefined1 *)((long)&(pNVar8->val).m_backend.data + uVar23 + 0x74);
      fVar5 = *(fpclass_type *)((long)&(pNVar8->val).m_backend.data + uVar23 + 0x78);
      iVar6 = *(int32_t *)((long)&(pNVar8->val).m_backend.data + uVar23 + 0x7c);
      memmove(&local_420,puVar16,0x70);
      pnVar19 = epsilon;
      pnVar22 = &local_120;
      for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pnVar22->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + ((ulong)bVar24 * -2 + 1) * 4);
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + ((ulong)bVar24 * -2 + 1) * 4);
      }
      local_120.m_backend.exp = (epsilon->m_backend).exp;
      local_120.m_backend.neg = (epsilon->m_backend).neg;
      local_120.m_backend.fpclass = (epsilon->m_backend).fpclass;
      local_120.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
      local_420.m_backend.exp = iVar4;
      local_420.m_backend.neg = (bool)uVar2;
      local_420.m_backend.fpclass = fVar5;
      local_420.m_backend.prec_elem = iVar6;
      bVar9 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_420,&local_120);
      if (!bVar9) {
        puVar16 = local_a0;
        pmVar21 = local_3a0;
        for (; lVar13 != 0; lVar13 = lVar13 + -1) {
          *(undefined4 *)pmVar21 = *puVar16;
          puVar16 = puVar16 + (ulong)bVar24 * -2 + 1;
          pmVar21 = pmVar21 + (ulong)bVar24 * -8 + 4;
        }
        local_330 = iVar4;
        local_32c = uVar2;
        local_328 = fVar5;
        local_324 = iVar6;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((type *)&nnzinv.m_backend,local_3a0,arg);
        dVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                           (&nnzinv.m_backend);
        local_530 = log2(dVar25);
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                  (&logsum.m_backend,&local_530);
        local_57c = local_57c + 1;
      }
      uVar23 = uVar23 + 0x84;
    }
    nnzinv.m_backend.fpclass = cpp_dec_float_finite;
    nnzinv.m_backend.prec_elem = 0x1c;
    nnzinv.m_backend.data._M_elems[0] = 0;
    nnzinv.m_backend.data._M_elems[1] = 0;
    nnzinv.m_backend.data._M_elems[2] = 0;
    nnzinv.m_backend.data._M_elems[3] = 0;
    nnzinv.m_backend.data._M_elems[4] = 0;
    nnzinv.m_backend.data._M_elems[5] = 0;
    nnzinv.m_backend.data._M_elems[6] = 0;
    nnzinv.m_backend.data._M_elems[7] = 0;
    nnzinv.m_backend.data._M_elems[8] = 0;
    nnzinv.m_backend.data._M_elems[9] = 0;
    nnzinv.m_backend.data._M_elems[10] = 0;
    nnzinv.m_backend.data._M_elems[0xb] = 0;
    nnzinv.m_backend.data._M_elems[0xc] = 0;
    nnzinv.m_backend.data._M_elems[0xd] = 0;
    nnzinv.m_backend.data._M_elems[0xe] = 0;
    nnzinv.m_backend.data._M_elems[0xf] = 0;
    nnzinv.m_backend.data._M_elems[0x10] = 0;
    nnzinv.m_backend.data._M_elems[0x11] = 0;
    nnzinv.m_backend.data._M_elems[0x12] = 0;
    nnzinv.m_backend.data._M_elems[0x13] = 0;
    nnzinv.m_backend.data._M_elems[0x14] = 0;
    nnzinv.m_backend.data._M_elems[0x15] = 0;
    nnzinv.m_backend.data._M_elems[0x16] = 0;
    nnzinv.m_backend.data._M_elems[0x17] = 0;
    nnzinv.m_backend.data._M_elems[0x18] = 0;
    nnzinv.m_backend.data._M_elems[0x19] = 0;
    nnzinv.m_backend.data._M_elems._104_5_ = 0;
    nnzinv.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    nnzinv.m_backend.exp = 0;
    nnzinv.m_backend.neg = false;
    if (local_57c < 1) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&logsum,1.0);
      dVar25 = 1.0;
    }
    else {
      dVar25 = 1.0 / (double)local_57c;
    }
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&nnzinv,dVar25);
    pnVar19 = &logsum;
    pnVar22 = &local_1a0;
    for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar22->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar24 * -2 + 1) * 4);
      pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar22 + ((ulong)bVar24 * -2 + 1) * 4);
    }
    local_1a0.m_backend.exp = logsum.m_backend.exp;
    local_1a0.m_backend.neg = logsum.m_backend.neg;
    local_1a0.m_backend.fpclass = logsum.m_backend.fpclass;
    local_1a0.m_backend.prec_elem = logsum.m_backend.prec_elem;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add(veclogs,(int)uVar14,&local_1a0);
    pcVar17 = (cpp_dec_float<200u,int,void> *)&nnzinv;
    pnVar19 = &local_220;
    for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = *(uint *)pcVar17;
      pcVar17 = pcVar17 + (ulong)bVar24 * -8 + 4;
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar24 * -2 + 1) * 4);
    }
    local_220.m_backend.exp = nnzinv.m_backend.exp;
    local_220.m_backend.neg = nnzinv.m_backend.neg;
    local_220.m_backend.fpclass = nnzinv.m_backend.fpclass;
    local_220.m_backend.prec_elem = nnzinv.m_backend.prec_elem;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add(vecnnzinv,(int)uVar14,&local_220);
    this = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::create(facset,local_57c);
    for (uVar23 = 0; uVar11 * 0x84 != uVar23; uVar23 = uVar23 + 0x84) {
      pNVar8 = (pIVar1->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      puVar18 = (uint *)((long)&(pNVar8->val).m_backend.data + uVar23);
      pnVar19 = &local_2a0;
      for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pnVar19->m_backend).data._M_elems[0] = *puVar18;
        puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + ((ulong)bVar24 * -2 + 1) * 4);
      }
      local_2a0.m_backend.exp = *(int *)((long)&(pNVar8->val).m_backend.data + uVar23 + 0x70);
      local_2a0.m_backend.neg = *(bool *)((long)&(pNVar8->val).m_backend.data + uVar23 + 0x74);
      local_2a0.m_backend._120_8_ =
           *(undefined8 *)((long)&(pNVar8->val).m_backend.data + uVar23 + 0x78);
      pnVar19 = epsilon;
      pnVar22 = &local_320;
      for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pnVar22->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + ((ulong)bVar24 * -2 + 1) * 4);
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + ((ulong)bVar24 * -2 + 1) * 4);
      }
      local_320.m_backend.exp = (epsilon->m_backend).exp;
      local_320.m_backend.neg = (epsilon->m_backend).neg;
      local_320.m_backend.fpclass = (epsilon->m_backend).fpclass;
      local_320.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
      bVar9 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_2a0,&local_320);
      if (!bVar9) {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(this,*(int *)((long)(&((pIVar1->data).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + uVar23),&nnzinv);
      }
    }
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::sort(this);
  }
  return;
}

Assistant:

static void initConstVecs(
   const SVSetBase<R>* vecset,
   SVSetBase<R>& facset,
   SSVectorBase<R>& veclogs,
   SSVectorBase<R>& vecnnzinv,
   R epsilon)
{
   assert(vecset != nullptr);

   const int nvec = vecset->num();

   for(int k = 0; k < nvec; ++k)
   {
      R logsum = 0.0;
      int nnz = 0;
      // get kth row or column of LP
      const SVectorBase<R>& lpvec = (*vecset)[k];
      const int size = lpvec.size();

      for(int i = 0; i < size; ++i)
      {
         const R a = lpvec.value(i);

         if(!isZero(a, epsilon))
         {
            logsum += log2(double(spxAbs(a))); // todo spxLog2?
            nnz++;
         }
      }

      R nnzinv;

      if(nnz > 0)
      {
         nnzinv = 1.0 / nnz;
      }
      else
      {
         /* all-0 entries */
         logsum = 1.0;
         nnzinv = 1.0;
      }

      veclogs.add(k, logsum);
      vecnnzinv.add(k, nnzinv);

      /* create new VectorBase<R> for facset */
      SVectorBase<R>& vecnew = (*(facset.create(nnz)));

      for(int i = 0; i < size; ++i)
      {
         if(!isZero(lpvec.value(i), epsilon))
            vecnew.add(lpvec.index(i), nnzinv);
      }

      vecnew.sort();
   }

   assert(veclogs.isSetup());
   assert(vecnnzinv.isSetup());
}